

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

double __thiscall soplex::SPxLPBase<double>::maxAbsNzo(SPxLPBase<double> *this,bool unscaled)

{
  int i;
  uint uVar1;
  undefined7 in_register_00000031;
  int i_1;
  long lVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  
  if (((int)CONCAT71(in_register_00000031,unscaled) == 0) || (this->_isScaled != true)) {
    dVar3 = 0.0;
    for (lVar2 = 0; lVar2 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        lVar2 = lVar2 + 1) {
      dVar4 = SVectorBase<double>::maxAbs
                        ((SVectorBase<double> *)
                         ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                         (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                         [lVar2].idx));
      if (dVar4 <= dVar3) {
        dVar4 = dVar3;
      }
      dVar3 = dVar4;
    }
  }
  else {
    dVar3 = 0.0;
    for (uVar1 = 0;
        (int)uVar1 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        uVar1 = uVar1 + 1) {
      (*this->lp_scaler->_vptr_SPxScaler[0x12])(this->lp_scaler,this,(ulong)uVar1);
      dVar4 = extraout_XMM0_Qa;
      if (extraout_XMM0_Qa <= dVar3) {
        dVar4 = dVar3;
      }
      dVar3 = dVar4;
    }
  }
  return dVar3;
}

Assistant:

inline
R SPxLPBase<R>::maxAbsNzo(bool unscaled) const
{
   R maxi = 0.0;

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMaxAbsUnscaled(*this, i);

         if(m > maxi)
            maxi = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).maxAbs();

         if(m > maxi)
            maxi = m;
      }
   }

   assert(maxi >= 0.0);

   return maxi;
}